

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

string * jsonnet::internal::bop_string_abi_cxx11_(BinaryOp bop)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffff50;
  allocator<char> *paVar1;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  undefined1 local_26 [2];
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [16];
  allocator<char> local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_20);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_21);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_22);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_23);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_24);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator((allocator<char> *)(local_26 + 1));
    break;
  case 10:
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_26;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator((allocator<char> *)local_26);
    break;
  case 0xb:
    paVar1 = &local_27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,(char *)paVar1,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 0xc:
    paVar1 = &local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,paVar1);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_2e);
    break;
  default:
    local_d._1_4_ = in_ESI;
    this = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognised binary operator: ");
    this_00 = (void *)std::ostream::operator<<(this,local_d._1_4_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    abort();
  }
  return in_RDI;
}

Assistant:

static inline std::string bop_string(BinaryOp bop)
{
    switch (bop) {
        case BOP_MULT: return "*";
        case BOP_DIV: return "/";
        case BOP_PERCENT: return "%";

        case BOP_PLUS: return "+";
        case BOP_MINUS: return "-";

        case BOP_SHIFT_L: return "<<";
        case BOP_SHIFT_R: return ">>";

        case BOP_GREATER: return ">";
        case BOP_GREATER_EQ: return ">=";
        case BOP_LESS: return "<";
        case BOP_LESS_EQ: return "<=";
        case BOP_IN: return "in";

        case BOP_MANIFEST_EQUAL: return "==";
        case BOP_MANIFEST_UNEQUAL: return "!=";

        case BOP_BITWISE_AND: return "&";
        case BOP_BITWISE_XOR: return "^";
        case BOP_BITWISE_OR: return "|";

        case BOP_AND: return "&&";
        case BOP_OR: return "||";

        default:
            std::cerr << "INTERNAL ERROR: Unrecognised binary operator: " << bop << std::endl;
            std::abort();
    }
}